

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void cmServer::reportMessage(char *msg,char *title,bool *param_3,void *data)

{
  string titleString;
  allocator local_51;
  string local_50;
  string local_30;
  
  if (data == (void *)0x0) {
    __assert_fail("request",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                  ,0xa4,
                  "static void cmServer::reportMessage(const char *, const char *, bool &, void *)")
    ;
  }
  if (msg != (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    if (title != (char *)0x0) {
      std::__cxx11::string::assign((char *)&local_50);
    }
    std::__cxx11::string::string((string *)&local_30,msg,&local_51);
    cmServerRequest::ReportMessage((cmServerRequest *)data,&local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  __assert_fail("msg",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0xa5,
                "static void cmServer::reportMessage(const char *, const char *, bool &, void *)");
}

Assistant:

void cmServer::reportMessage(const char* msg, const char* title,
                             bool& /* cancel */, void* data)
{
  const cmServerRequest* request = static_cast<const cmServerRequest*>(data);
  assert(request);
  assert(msg);
  std::string titleString;
  if (title) {
    titleString = title;
  }
  request->ReportMessage(std::string(msg), titleString);
}